

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  uint uVar1;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  int compressionLevel_local;
  ZSTD_CStream *zcs_local;
  
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zcs_local);
  if (uVar1 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_refCDict(zcs,(ZSTD_CDict *)0x0);
    uVar1 = ERR_isError((size_t)zcs_local);
    if (uVar1 == 0) {
      zcs_local = (ZSTD_CStream *)
                  ZSTD_CCtx_setParameter(zcs,ZSTD_c_compressionLevel,compressionLevel);
      uVar1 = ERR_isError((size_t)zcs_local);
      if (uVar1 == 0) {
        zcs_local = (ZSTD_CStream *)0x0;
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}